

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

VectorXd __thiscall Tools::CalculateRMSE(Tools *this,MeasurementContainer *measurements)

{
  VectorXd *pVVar1;
  Measurement *pMVar2;
  DenseIndex DVar3;
  double *pdVar4;
  DenseStorage<double,__1,__1,_1,_0> *pDVar5;
  Index size;
  pointer ppMVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  DenseStorage<double,__1,__1,_1,_0> *pDVar9;
  char *__function;
  long lVar10;
  DenseIndex extraout_RDX;
  Index index_3;
  Index size_4;
  pointer ppMVar11;
  Index index_4;
  double dVar12;
  double dVar13;
  double *pdVar14;
  undefined1 extraout_XMM0 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  VectorXd VVar18;
  VectorXd eso;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  VectorXd esc;
  VectorXd gto;
  VectorXd gtc;
  DenseStorage<double,__1,__1,_1,_0> local_e0;
  undefined1 local_c9 [9];
  ulong local_c0;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_b8;
  DenseStorage<double,__1,__1,_1,_0> *local_a0;
  ulong local_98;
  DenseStorage<double,__1,__1,_1,_0> local_90;
  DenseStorage<double,__1,__1,_1,_0> local_80;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  MeasurementContainer *local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  double local_48;
  undefined8 uStack_40;
  DenseStorage<double,__1,__1,_1,_0> *local_38;
  
  local_60 = measurements;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_e0,7,7,1);
  if (local_e0.m_rows < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (1 < (ulong)local_e0.m_rows) {
    uVar7 = 0;
    do {
      ((double **)local_e0.m_data)[uVar7] = (double *)0x0;
      ((double **)local_e0.m_data + uVar7)[1] = (double *)0x0;
      uVar7 = uVar7 + 2;
    } while (uVar7 < (local_e0.m_rows & 0x7ffffffffffffffeU));
  }
  if ((long)(local_e0.m_rows & 0x7ffffffffffffffeU) < local_e0.m_rows) {
    memset((void *)((long)(double **)local_e0.m_data + (local_e0.m_rows << 3 & 0xfffffffffffffff0U))
           ,0,(ulong)((uint)(local_e0.m_rows << 3) & 8));
  }
  ppMVar6 = (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar11 = ppMVar6;
  if (ppMVar6 !=
      (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_38 = (DenseStorage<double,__1,__1,_1,_0> *)this;
    do {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_90,7,7,1);
      pMVar2 = *ppMVar11;
      DVar3 = (pMVar2->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)(local_c9 + 1),DVar3,DVar3,1);
      pVVar1 = &pMVar2->estimate_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(local_c9 + 1),
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVVar1);
      if (local_c0 !=
          (pMVar2->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) {
LAB_00130131:
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0013017c;
      }
      uVar7 = local_c0 - ((long)local_c0 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)local_c0) {
        lVar10 = 0;
        do {
          pdVar14 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data + lVar10;
          dVar13 = pdVar14[1];
          *(double *)(local_c9._1_8_ + lVar10 * 8) = *pdVar14;
          ((double *)(local_c9._1_8_ + lVar10 * 8))[1] = dVar13;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar7);
      }
      if ((long)uVar7 < (long)local_c0) {
        pdVar14 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                  .m_data;
        do {
          *(double *)(local_c9._1_8_ + uVar7 * 8) = pdVar14[uVar7];
          uVar7 = uVar7 + 1;
        } while (local_c0 != uVar7);
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_70,7,7,1);
      pMVar2 = *ppMVar11;
      DVar3 = (pMVar2->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_80,DVar3,DVar3,1);
      pVVar1 = &pMVar2->ground_truth_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_80,
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVVar1);
      if (local_80.m_rows !=
          (pMVar2->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) goto LAB_00130131;
      uVar7 = local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_80.m_rows) {
        lVar10 = 0;
        do {
          pdVar14 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data + lVar10;
          dVar13 = pdVar14[1];
          local_80.m_data[lVar10] = *pdVar14;
          (local_80.m_data + lVar10)[1] = dVar13;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar7);
      }
      if ((long)uVar7 < local_80.m_rows) {
        pdVar14 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                  .m_data;
        do {
          local_80.m_data[uVar7] = pdVar14[uVar7];
          uVar7 = uVar7 + 1;
        } while (local_80.m_rows != uVar7);
      }
      if ((((local_80.m_rows < 1) || (local_70.m_rows < 1)) ||
          (*local_70.m_data = *local_80.m_data, local_80.m_rows == 1)) ||
         (((local_70.m_rows == 1 ||
           (local_70.m_data[1] = local_80.m_data[1], (ulong)local_80.m_rows < 3)) ||
          (((ulong)local_70.m_rows < 3 ||
           ((local_70.m_data[2] = local_80.m_data[2], local_80.m_rows == 3 || (local_70.m_rows == 3)
            ))))))) {
LAB_00130112:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar13 = local_80.m_data[3];
      local_70.m_data[3] = dVar13;
      if ((ulong)local_70.m_rows < 5) goto LAB_00130112;
      dVar15 = SQRT(local_80.m_data[2] * local_80.m_data[2] + dVar13 * dVar13);
      local_70.m_data[4] = dVar15;
      dVar12 = 1.5707963267948966;
      if (0.0001 <= ABS(dVar15)) {
        uStack_40 = 0;
        local_48 = dVar13;
        dVar12 = acos(local_80.m_data[2] / dVar15);
        dVar13 = local_48;
      }
      if (((((local_70.m_rows < 6) ||
            (local_70.m_data[5] =
                  (double)(~-(ulong)(dVar13 < 0.0) & (ulong)dVar12 |
                          (ulong)-dVar12 & -(ulong)(dVar13 < 0.0)), local_70.m_rows == 6)) ||
           (local_70.m_data[6] = 0.0, (long)local_c0 < 1)) ||
          ((local_90.m_rows < 1 || (*local_90.m_data = *(double *)local_c9._1_8_, local_c0 == 1))))
         || ((local_90.m_rows == 1 ||
             ((local_90.m_data[1] = *(double *)(local_c9._1_8_ + 8), local_c0 < 3 || (local_c0 == 3)
              ))))) goto LAB_00130112;
      local_48 = *(double *)(local_c9._1_8_ + 0x10);
      dVar13 = cos(*(double *)(local_c9._1_8_ + 0x18));
      if ((local_90.m_rows < 3) ||
         ((local_90.m_data[2] = local_48 * dVar13, (long)local_c0 < 3 || (local_c0 == 3))))
      goto LAB_00130112;
      local_48 = *(double *)(local_c9._1_8_ + 0x10);
      dVar13 = sin(*(double *)(local_c9._1_8_ + 0x18));
      if (((local_90.m_rows < 4) ||
          (((local_90.m_data[3] = local_48 * dVar13, (long)local_c0 < 3 || (local_90.m_rows == 4))
           || (local_90.m_data[4] = *(double *)(local_c9._1_8_ + 0x10), local_c0 == 3)))) ||
         ((((ulong)local_90.m_rows < 6 ||
           (local_90.m_data[5] = *(double *)(local_c9._1_8_ + 0x18), local_c0 < 5)) ||
          (local_90.m_rows == 6)))) goto LAB_00130112;
      local_90.m_data[6] = *(double *)(local_c9._1_8_ + 0x20);
      local_b8.m_functor = (scalar_sum_op<double> *)&local_70;
      local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_90;
      if (local_90.m_rows != local_70.m_rows) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x84,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_58,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_b8);
      local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_58;
      local_b8.m_functor = (scalar_sum_op<double> *)&local_58;
      if (local_58.m_rows < 0) goto LAB_00130148;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_b8);
      if (local_58.m_rows != *(DenseIndex *)((long)local_b8.m_functor + 8)) {
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>]"
        ;
        goto LAB_0013017c;
      }
      uVar7 = local_58.m_rows - (local_58.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_58.m_rows) {
        lVar10 = 0;
        do {
          dVar13 = (*(double **)
                     &(local_b8.m_matrix)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + lVar10)[1];
          dVar12 = (*(double **)&(local_b8.m_functor)->field_0x0 + lVar10)[1];
          local_58.m_data[lVar10] =
               (*(double **)
                 &(local_b8.m_matrix)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)[lVar10] *
               (*(double **)&(local_b8.m_functor)->field_0x0)[lVar10];
          (local_58.m_data + lVar10)[1] = dVar13 * dVar12;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar7);
      }
      if ((long)uVar7 < local_58.m_rows) {
        pdVar14 = *(double **)
                   &(local_b8.m_matrix)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        pdVar4 = *(double **)&(local_b8.m_functor)->field_0x0;
        do {
          local_58.m_data[uVar7] = pdVar14[uVar7] * pdVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while (local_58.m_rows != uVar7);
      }
      local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_e0;
      local_b8.m_functor = (scalar_sum_op<double> *)local_c9;
      Eigen::
      SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::operator=(&local_b8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_58);
      free(local_58.m_data);
      free(local_80.m_data);
      free(local_70.m_data);
      free((void *)local_c9._1_8_);
      free(local_90.m_data);
      ppMVar11 = ppMVar11 + 1;
    } while (ppMVar11 !=
             (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
    ppMVar6 = (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    this = (Tools *)local_38;
  }
  lVar10 = (long)ppMVar11 - (long)ppMVar6 >> 3;
  auVar17._8_4_ = (int)((long)ppMVar11 - (long)ppMVar6 >> 0x23);
  auVar17._0_8_ = lVar10;
  auVar17._12_4_ = 0x45300000;
  local_b8.m_functor =
       (scalar_sum_op<double> *)
       ((auVar17._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_e0;
  if (-1 < local_e0.m_rows) {
    uVar7 = local_e0.m_rows & 0x7ffffffffffffffe;
    if (1 < (ulong)local_e0.m_rows) {
      auVar16._8_8_ = local_b8.m_functor;
      auVar16._0_8_ = local_b8.m_functor;
      uVar8 = 0;
      do {
        auVar17 = divpd(*(undefined1 (*) [16])((double **)local_e0.m_data + uVar8),auVar16);
        *(undefined1 (*) [16])((double **)local_e0.m_data + uVar8) = auVar17;
        uVar8 = uVar8 + 2;
      } while (uVar8 < uVar7);
    }
    if ((long)uVar7 < local_e0.m_rows) {
      do {
        ((double **)local_e0.m_data)[uVar7] =
             (double *)((double)((double **)local_e0.m_data)[uVar7] / (double)local_b8.m_functor);
        uVar7 = uVar7 + 1;
      } while (local_e0.m_rows != uVar7);
    }
    local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_e0;
    if (-1 < local_e0.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
                 (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_b8);
      DVar3 = local_e0.m_rows;
      if (local_e0.m_rows == *(DenseIndex *)((long)local_b8.m_matrix + 8)) {
        uVar7 = local_e0.m_rows - (local_e0.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_e0.m_rows) {
          lVar10 = 0;
          auVar17 = extraout_XMM0;
          do {
            auVar17 = sqrtpd(auVar17,*(undefined1 (*) [16])
                                      (*(double **)
                                        &(local_b8.m_matrix)->
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      + lVar10));
            *(undefined1 (*) [16])((double **)local_e0.m_data + lVar10) = auVar17;
            lVar10 = lVar10 + 2;
          } while (lVar10 < (long)uVar7);
        }
        if ((long)uVar7 < local_e0.m_rows) {
          do {
            dVar13 = (*(double **)
                       &(local_b8.m_matrix)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)[uVar7];
            if (dVar13 < 0.0) {
              pdVar14 = (double *)sqrt(dVar13);
            }
            else {
              pdVar14 = (double *)SQRT(dVar13);
            }
            ((double **)local_e0.m_data)[uVar7] = pdVar14;
            uVar7 = uVar7 + 1;
          } while (DVar3 != uVar7);
        }
        local_b8.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)local_e0.m_data;
        local_b8.m_functor = (scalar_sum_op<double> *)0x4;
        local_98 = local_e0.m_rows;
        local_a0 = &local_e0;
        if (local_e0.m_rows < 4) {
          __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                        ,0x8d,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)this,4,4,1);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                   (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )&local_b8);
        pDVar5 = (DenseStorage<double,__1,__1,_1,_0> *)
                 ((DenseStorage<double,__1,__1,_1,_0> *)this)->m_rows;
        if (pDVar5 == (DenseStorage<double,__1,__1,_1,_0> *)local_b8.m_functor) {
          pDVar9 = (DenseStorage<double,__1,__1,_1,_0> *)
                   ((long)pDVar5 - ((long)pDVar5 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)pDVar5) {
            lVar10 = 0;
            do {
              dVar13 = (double)((double **)
                               ((long)&(local_b8.m_matrix)->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               + lVar10 * 8))[1];
              pdVar14 = ((DenseStorage<double,__1,__1,_1,_0> *)this)->m_data;
              pdVar14[lVar10] =
                   (double)*(double **)
                            ((long)&(local_b8.m_matrix)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> +
                            lVar10 * 8);
              (pdVar14 + lVar10)[1] = dVar13;
              lVar10 = lVar10 + 2;
            } while (lVar10 < (long)pDVar9);
          }
          if ((long)pDVar9 < (long)pDVar5) {
            pdVar14 = ((DenseStorage<double,__1,__1,_1,_0> *)this)->m_data;
            do {
              pdVar14[(long)pDVar9] =
                   (double)*(double **)
                            ((long)&(local_b8.m_matrix)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> +
                            pDVar9 * 8);
              pDVar9 = (DenseStorage<double,__1,__1,_1,_0> *)((long)&pDVar9->m_data + 1);
            } while (pDVar5 != pDVar9);
          }
          free(local_e0.m_data);
          VVar18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               extraout_RDX;
          VVar18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)this;
          return (VectorXd)
                 VVar18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
        }
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
        ;
      }
      else {
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>]"
        ;
      }
LAB_0013017c:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,__function);
    }
  }
LAB_00130148:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

VectorXd Tools::CalculateRMSE(const MeasurementContainer measurements) {

    VectorXd rmse(7); // [px, py, vx, vy, v, psi, psi dot]T
    rmse.fill(0.0);
    
    //accumulate squared residuals
    for (MeasurementContainer::const_iterator it=measurements.begin(); it!=measurements.end(); ++it) {

        VectorXd esc(7);                      // calculated estimates
        VectorXd eso = (*it)->estimate_;      // original estimate
        VectorXd gtc(7);                      // calculated ground truth
        VectorXd gto = (*it)->ground_truth_;  // original ground truth

        gtc(0) = gto(0); 
	gtc(1) = gto(1);
        gtc(2) = gto(2);
	gtc(3) = gto(3);
	double s = (gtc(3)<0)?-1.0:1.0; // angle sign
        gtc(4) = sqrt(gto(2)*gto(2)+gto(3)*gto(3));
	gtc(5) = (fabs(gtc(4))<0.0001) ? M_PI/2 : acos(gto(2)/gtc(4));
	gtc(5) *= s;
	gtc(6) = 0;

        esc(0) = eso(0);
	esc(1) = eso(1);
	esc(2) = eso(2) * cos(eso(3));
	esc(3) = eso(2) * sin(eso(3));
	esc(4) = eso(2);
	esc(5) = eso(3);
	esc(6) = eso(4);

        VectorXd residual = esc- gtc;
        
        // coefficient-wise multiplication
        residual = residual.array()*residual.array();
        rmse += residual;
    }
    
    // calculate the mean
    rmse = rmse / measurements.size();
    //calculate the squared root
    rmse = rmse.array().sqrt();

    return rmse.head(4);  // for now, return only px, py, vx, vy
}